

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O1

void __thiscall QProcess::startCommand(QProcess *this,QString *command,OpenMode mode)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  int *piVar4;
  iterator iVar5;
  storage_type_conflict *in_RCX;
  long in_FS_OFFSET;
  QStringView command_00;
  value_type v;
  QMessageLogger local_68;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  command_00.m_data = in_RCX;
  command_00.m_size = (qsizetype)(command->d).ptr;
  splitCommand((QStringList *)&local_48,(QProcess *)(command->d).size,command_00);
  if ((undefined1 *)local_48.size == (undefined1 *)0x0) {
    local_68.context.version = 2;
    local_68.context.line = 0;
    local_68.context.file._0_4_ = 0;
    local_68.context.file._4_4_ = 0;
    local_68.context.function._0_4_ = 0;
    local_68.context.function._4_4_ = 0;
    local_68.context.category = "default";
    QMessageLogger::warning
              (&local_68,"QProcess::startCommand: empty or whitespace-only command was provided");
  }
  else {
    local_68.context.function._0_4_ = 0xaaaaaaaa;
    local_68.context.function._4_4_ = 0xaaaaaaaa;
    local_68.context.version = -0x55555556;
    local_68.context.line = -0x55555556;
    local_68.context.file._0_4_ = 0xaaaaaaaa;
    local_68.context.file._4_4_ = 0xaaaaaaaa;
    iVar5 = QList<QString>::begin((QList<QString> *)&local_48);
    pDVar2 = ((iVar5.i)->d).d;
    pcVar3 = ((iVar5.i)->d).ptr;
    ((iVar5.i)->d).d = (Data *)0x0;
    ((iVar5.i)->d).ptr = (char16_t *)0x0;
    local_68.context.version = (int)pDVar2;
    local_68.context.line = (int)((ulong)pDVar2 >> 0x20);
    local_68.context.file._0_4_ = SUB84(pcVar3,0);
    local_68.context.file._4_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
    qVar1 = ((iVar5.i)->d).size;
    ((iVar5.i)->d).size = 0;
    local_68.context.function._0_4_ = (undefined4)qVar1;
    local_68.context.function._4_4_ = (undefined4)((ulong)qVar1 >> 0x20);
    QtPrivate::QGenericArrayOps<QString>::eraseFirst((QGenericArrayOps<QString> *)&local_48);
    start(this,(QString *)&local_68,(QStringList *)&local_48,mode);
    piVar4 = (int *)CONCAT44(local_68.context.line,local_68.context.version);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_68.context.line,local_68.context.version),2,0x10);
      }
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProcess::startCommand(const QString &command, OpenMode mode)
{
    QStringList args = splitCommand(command);
    if (args.isEmpty()) {
        qWarning("QProcess::startCommand: empty or whitespace-only command was provided");
        return;
    }
    const QString program = args.takeFirst();
    start(program, args, mode);
}